

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_encoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialNormalAttributeEncoder::Init
          (SequentialNormalAttributeEncoder *this,PointCloudEncoder *encoder,int attribute_id)

{
  EncoderOptions *this_00;
  bool bVar1;
  int quantization_bits;
  allocator<char> local_45;
  int attribute_id_local;
  string local_40;
  
  attribute_id_local = attribute_id;
  bVar1 = SequentialIntegerAttributeEncoder::Init
                    (&this->super_SequentialIntegerAttributeEncoder,encoder,attribute_id);
  if ((bVar1) &&
     ((((this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.attribute_)
      ->super_GeometryAttribute).num_components_ == '\x03')) {
    this_00 = encoder->options_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"quantization_bits",&local_45);
    quantization_bits =
         DracoOptions<int>::GetAttributeInt
                   (&this_00->super_DracoOptions<int>,&attribute_id_local,&local_40,-1);
    std::__cxx11::string::~string((string *)&local_40);
    if (0 < quantization_bits) {
      AttributeOctahedronTransform::SetParameters
                (&this->attribute_octahedron_transform_,quantization_bits);
      return true;
    }
  }
  return false;
}

Assistant:

bool SequentialNormalAttributeEncoder::Init(PointCloudEncoder *encoder,
                                            int attribute_id) {
  if (!SequentialIntegerAttributeEncoder::Init(encoder, attribute_id)) {
    return false;
  }
  // Currently this encoder works only for 3-component normal vectors.
  if (attribute()->num_components() != 3) {
    return false;
  }

  // Initialize AttributeOctahedronTransform.
  const int quantization_bits = encoder->options()->GetAttributeInt(
      attribute_id, "quantization_bits", -1);
  if (quantization_bits < 1) {
    return false;
  }
  attribute_octahedron_transform_.SetParameters(quantization_bits);
  return true;
}